

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_SequenceNumberRecovery::_Run(_Test_SequenceNumberRecovery *this)

{
  DB *pDVar1;
  Tester local_1568;
  Slice local_13c8;
  ReadOptions local_13b8;
  Status local_13a0;
  Tester local_1398;
  Tester local_11f8;
  Slice local_1058;
  ReadOptions local_1048;
  Status local_1030;
  Tester local_1028;
  Slice local_e88;
  Slice local_e78;
  WriteOptions local_e61;
  Status local_e60;
  Tester local_e58;
  Tester local_cb8;
  Slice local_b18;
  ReadOptions local_b08;
  Status local_af8;
  Tester local_af0;
  string local_950 [8];
  string v;
  Slice local_930;
  Slice local_920;
  WriteOptions local_909;
  Status local_908;
  Tester local_900;
  Slice local_760;
  Slice local_750;
  WriteOptions local_739;
  Status local_738;
  Tester local_730;
  Slice local_590;
  Slice local_580;
  WriteOptions local_569;
  Status local_568;
  Tester local_560;
  Slice local_3c0;
  Slice local_3b0;
  WriteOptions local_399;
  Status local_398;
  Tester local_390;
  Slice local_1f0 [2];
  Slice local_1d0;
  WriteOptions local_1b9;
  Status local_1b8;
  Tester local_1b0;
  _Test_SequenceNumberRecovery *local_10;
  _Test_SequenceNumberRecovery *this_local;
  
  local_10 = this;
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x10f);
  pDVar1 = (this->super_CorruptionTest).db_;
  local_1b9.sync = false;
  WriteOptions::WriteOptions(&local_1b9);
  Slice::Slice(&local_1d0,"foo");
  Slice::Slice(local_1f0,"v1");
  (*pDVar1->_vptr_DB[2])(&local_1b8,pDVar1,&local_1b9,&local_1d0,local_1f0);
  test::Tester::IsOk(&local_1b0,&local_1b8);
  Status::~Status(&local_1b8);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_390,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x110);
  pDVar1 = (this->super_CorruptionTest).db_;
  local_399.sync = false;
  WriteOptions::WriteOptions(&local_399);
  Slice::Slice(&local_3b0,"foo");
  Slice::Slice(&local_3c0,"v2");
  (*pDVar1->_vptr_DB[2])(&local_398,pDVar1,&local_399,&local_3b0,&local_3c0);
  test::Tester::IsOk(&local_390,&local_398);
  Status::~Status(&local_398);
  test::Tester::~Tester(&local_390);
  test::Tester::Tester
            (&local_560,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x111);
  pDVar1 = (this->super_CorruptionTest).db_;
  local_569.sync = false;
  WriteOptions::WriteOptions(&local_569);
  Slice::Slice(&local_580,"foo");
  Slice::Slice(&local_590,"v3");
  (*pDVar1->_vptr_DB[2])(&local_568,pDVar1,&local_569,&local_580,&local_590);
  test::Tester::IsOk(&local_560,&local_568);
  Status::~Status(&local_568);
  test::Tester::~Tester(&local_560);
  test::Tester::Tester
            (&local_730,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x112);
  pDVar1 = (this->super_CorruptionTest).db_;
  local_739.sync = false;
  WriteOptions::WriteOptions(&local_739);
  Slice::Slice(&local_750,"foo");
  Slice::Slice(&local_760,"v4");
  (*pDVar1->_vptr_DB[2])(&local_738,pDVar1,&local_739,&local_750,&local_760);
  test::Tester::IsOk(&local_730,&local_738);
  Status::~Status(&local_738);
  test::Tester::~Tester(&local_730);
  test::Tester::Tester
            (&local_900,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x113);
  pDVar1 = (this->super_CorruptionTest).db_;
  local_909.sync = false;
  WriteOptions::WriteOptions(&local_909);
  Slice::Slice(&local_920,"foo");
  Slice::Slice(&local_930,"v5");
  (*pDVar1->_vptr_DB[2])(&local_908,pDVar1,&local_909,&local_920,&local_930);
  test::Tester::IsOk(&local_900,&local_908);
  Status::~Status(&local_908);
  test::Tester::~Tester(&local_900);
  CorruptionTest::RepairDB(&this->super_CorruptionTest);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  std::__cxx11::string::string(local_950);
  test::Tester::Tester
            (&local_af0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x117);
  pDVar1 = (this->super_CorruptionTest).db_;
  local_b08.verify_checksums = false;
  local_b08.fill_cache = false;
  local_b08._2_6_ = 0;
  local_b08.snapshot = (Snapshot *)0x0;
  ReadOptions::ReadOptions(&local_b08);
  Slice::Slice(&local_b18,"foo");
  (*pDVar1->_vptr_DB[5])(&local_af8,pDVar1,&local_b08,&local_b18,local_950);
  test::Tester::IsOk(&local_af0,&local_af8);
  Status::~Status(&local_af8);
  test::Tester::~Tester(&local_af0);
  test::Tester::Tester
            (&local_cb8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x118);
  test::Tester::IsEq<char[3],std::__cxx11::string>
            (&local_cb8,(char (*) [3])"v5",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_950);
  test::Tester::~Tester(&local_cb8);
  test::Tester::Tester
            (&local_e58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x11b);
  pDVar1 = (this->super_CorruptionTest).db_;
  local_e61.sync = false;
  WriteOptions::WriteOptions(&local_e61);
  Slice::Slice(&local_e78,"foo");
  Slice::Slice(&local_e88,"v6");
  (*pDVar1->_vptr_DB[2])(&local_e60,pDVar1,&local_e61,&local_e78,&local_e88);
  test::Tester::IsOk(&local_e58,&local_e60);
  Status::~Status(&local_e60);
  test::Tester::~Tester(&local_e58);
  test::Tester::Tester
            (&local_1028,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x11c);
  pDVar1 = (this->super_CorruptionTest).db_;
  local_1048.verify_checksums = false;
  local_1048.fill_cache = false;
  local_1048._2_6_ = 0;
  local_1048.snapshot = (Snapshot *)0x0;
  ReadOptions::ReadOptions(&local_1048);
  Slice::Slice(&local_1058,"foo");
  (*pDVar1->_vptr_DB[5])(&local_1030,pDVar1,&local_1048,&local_1058,local_950);
  test::Tester::IsOk(&local_1028,&local_1030);
  Status::~Status(&local_1030);
  test::Tester::~Tester(&local_1028);
  test::Tester::Tester
            (&local_11f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x11d);
  test::Tester::IsEq<char[3],std::__cxx11::string>
            (&local_11f8,(char (*) [3])"v6",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_950);
  test::Tester::~Tester(&local_11f8);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  test::Tester::Tester
            (&local_1398,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x11f);
  pDVar1 = (this->super_CorruptionTest).db_;
  local_13b8.verify_checksums = false;
  local_13b8.fill_cache = false;
  local_13b8._2_6_ = 0;
  local_13b8.snapshot = (Snapshot *)0x0;
  ReadOptions::ReadOptions(&local_13b8);
  Slice::Slice(&local_13c8,"foo");
  (*pDVar1->_vptr_DB[5])(&local_13a0,pDVar1,&local_13b8,&local_13c8,local_950);
  test::Tester::IsOk(&local_1398,&local_13a0);
  Status::~Status(&local_13a0);
  test::Tester::~Tester(&local_1398);
  test::Tester::Tester
            (&local_1568,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x120);
  test::Tester::IsEq<char[3],std::__cxx11::string>
            (&local_1568,(char (*) [3])"v6",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_950);
  test::Tester::~Tester(&local_1568);
  std::__cxx11::string::~string(local_950);
  return;
}

Assistant:

TEST(CorruptionTest, SequenceNumberRecovery) {
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v1"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v2"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v3"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v4"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v5"));
  RepairDB();
  Reopen();
  std::string v;
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("v5", v);
  // Write something.  If sequence number was not recovered properly,
  // it will be hidden by an earlier write.
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v6"));
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("v6", v);
  Reopen();
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("v6", v);
}